

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_pi_value(xml_buffered_writer *writer,char_t *s)

{
  xml_buffered_writer *in_RSI;
  xml_buffered_writer *in_RDI;
  char_t *prev;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  byte bVar1;
  xml_buffered_writer *this;
  
  while (this = in_RSI, in_RSI->buffer[0] != '\0') {
    while( true ) {
      bVar1 = 0;
      if (this->buffer[0] != '\0') {
        in_stack_ffffffffffffffe6 = false;
        if (this->buffer[0] == '?') {
          in_stack_ffffffffffffffe6 = this->buffer[1] == '>';
        }
        bVar1 = in_stack_ffffffffffffffe6 ^ 0xff;
      }
      if ((bVar1 & 1) == 0) break;
      this = (xml_buffered_writer *)(this->buffer + 1);
    }
    xml_buffered_writer::write_buffer
              (this,in_RSI->buffer,
               CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
    in_RSI = this;
    if (this->buffer[0] != '\0') {
      xml_buffered_writer::write(in_RDI,0x3f,(void *)0x20,0x3e);
      in_RSI = (xml_buffered_writer *)(this->buffer + 2);
    }
  }
  return;
}

Assistant:

PUGI__FN void node_output_pi_value(xml_buffered_writer& writer, const char_t* s)
	{
		while (*s)
		{
			const char_t* prev = s;

			// look for ?> sequence - we can't output it since ?> terminates PI
			while (*s && !(s[0] == '?' && s[1] == '>')) ++s;

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			if (*s)
			{
				assert(s[0] == '?' && s[1] == '>');

				writer.write('?', ' ', '>');
				s += 2;
			}
		}
	}